

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

intptr_t fio_connect(fio_connect_args args)

{
  fio_protocol_s *__dest;
  uintptr_t uVar1;
  int *piVar2;
  char *in_stack_00000008;
  code *local_a0;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  undefined8 local_50;
  fio_connect_protocol_s *local_48;
  void *local_40;
  _func_void_intptr_t_void_ptr *local_38;
  char *local_30;
  _func_void_intptr_t_void_ptr *local_28;
  fio_protocol_s *local_20;
  fio_connect_protocol_s *pr;
  intptr_t uuid;
  
  if (((args.port == (char *)0x0) &&
      ((args.on_fail == (_func_void_intptr_t_void_ptr *)0x0 ||
       (uVar1 = fio_tls_alpn_count(args.on_fail), uVar1 == 0)))) ||
     ((in_stack_00000008 == (char *)0x0 && (args.address == (char *)0x0)))) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    pr = (fio_connect_protocol_s *)fio_socket(in_stack_00000008,args.address,'\0');
    if (pr != (fio_connect_protocol_s *)0xffffffffffffffff) {
      fio_timeout_set((intptr_t)pr,(uint8_t)args.udata);
      local_20 = (fio_protocol_s *)fio_malloc(0x58);
      if (local_20 != (fio_protocol_s *)0x0) {
        if (args.on_fail != (_func_void_intptr_t_void_ptr *)0x0) {
          fio_tls_dup(args.on_fail);
        }
        __dest = local_20;
        local_78 = 0;
        if (args.on_fail == (_func_void_intptr_t_void_ptr *)0x0) {
          local_a0 = fio_connect_on_ready;
        }
        else {
          uVar1 = fio_tls_alpn_count(args.on_fail);
          local_a0 = fio_connect_on_ready_tls;
          if (uVar1 != 0) {
            local_a0 = fio_connect_on_ready_tls_alpn;
          }
        }
        local_70 = local_a0;
        local_68 = 0;
        local_60 = fio_connect_on_close;
        local_58 = 0;
        local_50 = 0;
        local_48 = pr;
        local_40 = args.tls;
        local_38 = args.on_fail;
        local_30 = args.port;
        local_28 = args.on_connect;
        memcpy(__dest,&local_78,0x58);
        fio_attach((intptr_t)pr,local_20);
        return (intptr_t)pr;
      }
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:4753"
                      );
      }
      kill(0,2);
      piVar2 = __errno_location();
      exit(*piVar2);
    }
    pr = (fio_connect_protocol_s *)0xffffffffffffffff;
  }
  if (args.on_connect != (_func_void_intptr_t_void_ptr *)0x0) {
    (*args.on_connect)(-1,args.tls);
  }
  return -1;
}

Assistant:

intptr_t fio_connect FIO_IGNORE_MACRO(struct fio_connect_args args) {
  if ((!args.on_connect && (!args.tls || !fio_tls_alpn_count(args.tls))) ||
      (!args.address && !args.port)) {
    errno = EINVAL;
    goto error;
  }
  const intptr_t uuid = fio_socket(args.address, args.port, 0);
  if (uuid == -1)
    goto error;
  fio_timeout_set(uuid, args.timeout);

  fio_connect_protocol_s *pr = fio_malloc(sizeof(*pr));
  FIO_ASSERT_ALLOC(pr);

  if (args.tls)
    fio_tls_dup(args.tls);

  *pr = (fio_connect_protocol_s){
      .pr =
          {
              .on_ready = (args.tls ? (fio_tls_alpn_count(args.tls)
                                           ? fio_connect_on_ready_tls_alpn
                                           : fio_connect_on_ready_tls)
                                    : fio_connect_on_ready),
              .on_close = fio_connect_on_close,
          },
      .uuid = uuid,
      .tls = args.tls,
      .udata = args.udata,
      .on_connect = args.on_connect,
      .on_fail = args.on_fail,
  };
  fio_attach(uuid, &pr->pr);
  return uuid;
error:
  if (args.on_fail)
    args.on_fail(-1, args.udata);
  return -1;
}